

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_md5.cpp
# Opt level: O0

void __thiscall ON_MD5::set_final_hash(ON_MD5 *this)

{
  uint uVar1;
  ON__UINT32 local_2c;
  ON__UINT32 padLen;
  ON__UINT32 index;
  uchar bits [8];
  ON_MD5 *this_local;
  
  bits = (uchar  [8])this;
  MD5_encode((ON__UINT8 *)&padLen,this->m_bit_count,8);
  uVar1 = this->m_bit_count[0] >> 3 & 0x3f;
  if (uVar1 < 0x38) {
    local_2c = 0x38 - uVar1;
  }
  else {
    local_2c = 0x78 - uVar1;
  }
  Internal_Accumulate(this,set_final_hash::padding,local_2c);
  Internal_Accumulate(this,(ON__UINT8 *)&padLen,8);
  MD5_encode((this->m_md5_hash).m_digest,this->m_state,0x10);
  return;
}

Assistant:

void ON_MD5::set_final_hash()
{
  // MD5 finalization. 
  // Ends an MD5 message-digest operation and writes the message digest.
  static unsigned char padding[64] = {
    0x80, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0
  };

  // Save number of bits
  unsigned char bits[8];
  MD5_encode(bits, m_bit_count, 8);
 
  // pad out to 56 mod 64.
  const ON__UINT32 index = (m_bit_count[0] / 8) % 64;
  const ON__UINT32 padLen = (index < 56) ? (56 - index) : (120 - index);
  Internal_Accumulate(padding, padLen);
 
  // Append length (before padding)
  Internal_Accumulate(bits, 8);
 
  // Store final state in digest
  MD5_encode(m_md5_hash.m_digest, m_state, 16);
}